

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

bool __thiscall Am_Value_List::Member(Am_Value_List *this,Am_Wrapper *value)

{
  Am_List_Item *pAVar1;
  bool bVar2;
  Am_List_Item *old_item;
  Am_Wrapper *value_local;
  Am_Value_List *this_local;
  
  pAVar1 = this->item;
  while( true ) {
    if (this->item == (Am_List_Item *)0x0) {
      this->item = pAVar1;
      if (value != (Am_Wrapper *)0x0) {
        Am_Wrapper::Release(value);
      }
      return false;
    }
    bVar2 = Am_Value::operator==(&this->item->super_Am_Value,value);
    if (bVar2) break;
    this->item = this->item->next;
  }
  if (value != (Am_Wrapper *)0x0) {
    Am_Wrapper::Release(value);
  }
  return true;
}

Assistant:

bool
Am_Value_List::Member(Am_Wrapper *value)
{
  Am_List_Item *old_item = item;
  while (item) {
    if (*item == value) {
      if (value)
        value->Release();
      return true;
    }
    item = item->next;
  }
  item = old_item;
  if (value)
    value->Release();
  return false;
}